

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::DebugInfoManager::ReplaceAllUsesInDebugScopeWithPredicate
          (DebugInfoManager *this,uint32_t before,uint32_t after,
          function<bool_(spvtools::opt::Instruction_*)> *predicate)

{
  Instruction *pIVar1;
  bool bVar2;
  iterator iVar3;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var4;
  unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
  *puVar5;
  long *plVar6;
  uint32_t local_38;
  uint32_t local_34;
  
  _local_38 = CONCAT44(before,after);
  puVar5 = &this->scope_id_to_users_;
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&puVar5->_M_h,&local_34);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    plVar6 = (long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                            ._M_cur + 0x20);
    while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
      pIVar1 = (Instruction *)plVar6[1];
      bVar2 = std::function<bool_(spvtools::opt::Instruction_*)>::operator()(predicate,pIVar1);
      if (bVar2) {
        Instruction::UpdateLexicalScope(pIVar1,local_38);
      }
    }
    p_Var4 = &std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)puVar5,&local_38)->_M_h;
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::operator=(p_Var4,(_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)((long)iVar3.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                                 ._M_cur + 0x10));
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&puVar5->_M_h,
            (const_iterator)
            iVar3.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
            ._M_cur);
  }
  puVar5 = &this->inlinedat_id_to_users_;
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&puVar5->_M_h,&local_34);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    plVar6 = (long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                            ._M_cur + 0x20);
    while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
      pIVar1 = (Instruction *)plVar6[1];
      bVar2 = std::function<bool_(spvtools::opt::Instruction_*)>::operator()(predicate,pIVar1);
      if (bVar2) {
        Instruction::UpdateDebugInlinedAt(pIVar1,local_38);
      }
    }
    p_Var4 = &std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)puVar5,&local_38)->_M_h;
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::operator=(p_Var4,(_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)((long)iVar3.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                                 ._M_cur + 0x10));
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&puVar5->_M_h,
            (const_iterator)
            iVar3.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
            ._M_cur);
  }
  return;
}

Assistant:

void DebugInfoManager::ReplaceAllUsesInDebugScopeWithPredicate(
    uint32_t before, uint32_t after,
    const std::function<bool(Instruction*)>& predicate) {
  auto scope_id_to_users_itr = scope_id_to_users_.find(before);
  if (scope_id_to_users_itr != scope_id_to_users_.end()) {
    for (Instruction* inst : scope_id_to_users_itr->second) {
      if (predicate(inst)) inst->UpdateLexicalScope(after);
    }
    scope_id_to_users_[after] = scope_id_to_users_itr->second;
    scope_id_to_users_.erase(scope_id_to_users_itr);
  }
  auto inlinedat_id_to_users_itr = inlinedat_id_to_users_.find(before);
  if (inlinedat_id_to_users_itr != inlinedat_id_to_users_.end()) {
    for (Instruction* inst : inlinedat_id_to_users_itr->second) {
      if (predicate(inst)) inst->UpdateDebugInlinedAt(after);
    }
    inlinedat_id_to_users_[after] = inlinedat_id_to_users_itr->second;
    inlinedat_id_to_users_.erase(inlinedat_id_to_users_itr);
  }
}